

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

pool_ptr<soul::AST::ASTObject> __thiscall
soul::SourceCodeUtilities::findASTObjectAt
          (SourceCodeUtilities *this,ASTObject *root,CodeLocation *targetLocation)

{
  undefined **local_28;
  char *local_20;
  undefined8 local_18;
  
  local_28 = &PTR__FindLocationVisitor_002ca558;
  local_18 = 0;
  local_20 = (targetLocation->location).data;
  findASTObjectAt(soul::AST::ASTObject&,soul::CodeLocation)::FindLocationVisitor::visitObject(soul::
  AST::ASTObject__(&local_28,root);
  *(undefined8 *)this = local_18;
  return (pool_ptr<soul::AST::ASTObject>)(ASTObject *)this;
}

Assistant:

pool_ptr<AST::ASTObject> SourceCodeUtilities::findASTObjectAt (AST::ASTObject& root, CodeLocation targetLocation)
{
    struct FindLocationVisitor  : public ASTVisitor
    {
        void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto distance = target - o.context.location.location.getAddress();

            if (distance == 0
                 || (distance > 0
                      && result != nullptr
                      && distance < target - result->context.location.location.getAddress()))
                result = o;
        }

        const char* target = nullptr;
        pool_ptr<AST::ASTObject> result;
    };

    FindLocationVisitor v;
    v.target = targetLocation.location.getAddress();
    v.visitObject (root);
    return v.result;
}